

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.cpp
# Opt level: O3

bool __thiscall
AI::Condition::isTrue
          (Condition *this,WorldState *state,Task *task,
          vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
          *satisfiablePredicates,bool isMerged)

{
  float fVar1;
  WorldStateIdentifier WVar2;
  SatisfiablePredicateIdentifier SVar3;
  ConsumableFact CVar4;
  pointer pRVar5;
  pointer pRVar6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pCVar9;
  undefined1 *puVar10;
  Task *pTVar11;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *pvVar12;
  bool bVar13;
  byte bVar14;
  _Base_ptr p_Var15;
  pointer pCVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  pointer pSVar19;
  _Rb_tree_header *p_Var20;
  pointer pSVar21;
  long lVar22;
  long lVar23;
  pointer pSVar24;
  _Base_ptr p_Var25;
  RequiredValue *requiredValue;
  pointer pRVar26;
  RequiredFlag *requiredFlag;
  pointer pRVar27;
  int local_44;
  Task *local_40;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *local_38;
  
  pRVar27 = (this->requiredFlags).
            super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar5 = (this->requiredFlags).
           super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_40 = task;
  local_38 = satisfiablePredicates;
  if (pRVar27 != pRVar5) {
    p_Var20 = &(state->current).flags._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var18 = (state->current).flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var18 == (_Base_ptr)0x0) {
LAB_0011ecb3:
        log<char_const*,char_const*>("[Condition] ","ERROR: flag missing");
        p_Var15 = &p_Var20->_M_header;
      }
      else {
        WVar2 = pRVar27->id;
        p_Var15 = &p_Var20->_M_header;
        do {
          if ((int)WVar2 <= (int)*(size_t *)(p_Var18 + 1)) {
            p_Var15 = p_Var18;
          }
          p_Var18 = (&p_Var18->_M_left)[(int)*(size_t *)(p_Var18 + 1) < (int)WVar2];
        } while (p_Var18 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var15 == p_Var20) ||
           ((int)WVar2 < (int)((_Rb_tree_header *)p_Var15)->_M_node_count)) goto LAB_0011ecb3;
      }
      if ((bool)*(undefined1 *)((long)&((_Rb_tree_header *)p_Var15)->_M_node_count + 4) !=
          pRVar27->flag) {
        return (bool)0;
      }
      pRVar27 = pRVar27 + 1;
    } while (pRVar27 != pRVar5);
  }
  pRVar26 = (this->requiredValues).
            super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar6 = (this->requiredValues).
           super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar26 != pRVar6) {
    p_Var20 = &(state->current).values._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var18 = (state->current).values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var18 == (_Base_ptr)0x0) {
LAB_0011ed30:
        log<char_const*,char_const*>("[Condition] ","ERROR: flag missing");
        p_Var15 = &p_Var20->_M_header;
      }
      else {
        WVar2 = pRVar26->id;
        p_Var15 = &p_Var20->_M_header;
        do {
          if ((int)WVar2 <= (int)*(size_t *)(p_Var18 + 1)) {
            p_Var15 = p_Var18;
          }
          p_Var18 = (&p_Var18->_M_left)[(int)*(size_t *)(p_Var18 + 1) < (int)WVar2];
        } while (p_Var18 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var15 == p_Var20) ||
           ((int)WVar2 < (int)((_Rb_tree_header *)p_Var15)->_M_node_count)) goto LAB_0011ed30;
      }
      switch(pRVar26->op) {
      case LessThan:
        if (pRVar26->value <= *(float *)((long)&((_Rb_tree_header *)p_Var15)->_M_node_count + 4)) {
          return (bool)0;
        }
        break;
      case LessEqual:
        fVar1 = *(float *)((long)&((_Rb_tree_header *)p_Var15)->_M_node_count + 4);
        if (pRVar26->value <= fVar1 && fVar1 != pRVar26->value) {
          return (bool)0;
        }
        break;
      case EqualTo:
        fVar1 = *(float *)((long)&((_Rb_tree_header *)p_Var15)->_M_node_count + 4);
        if (fVar1 != pRVar26->value) {
          return (bool)0;
        }
        if (NAN(fVar1) || NAN(pRVar26->value)) {
          return (bool)0;
        }
        break;
      case NotEqualTo:
        fVar1 = *(float *)((long)&((_Rb_tree_header *)p_Var15)->_M_node_count + 4);
        if ((fVar1 == pRVar26->value) && (!NAN(fVar1) && !NAN(pRVar26->value))) {
          return (bool)0;
        }
        break;
      case GreaterThan:
        if (*(float *)((long)&((_Rb_tree_header *)p_Var15)->_M_node_count + 4) <= pRVar26->value) {
          return (bool)0;
        }
        break;
      case GreaterEqual:
        puVar10 = (undefined1 *)((long)&((_Rb_tree_header *)p_Var15)->_M_node_count + 4);
        if (*(float *)puVar10 <= pRVar26->value && pRVar26->value != *(float *)puVar10) {
          return (bool)0;
        }
      }
      pRVar26 = pRVar26 + 1;
    } while (pRVar26 != pRVar6);
  }
  pvVar12 = local_38;
  pTVar11 = local_40;
  if (!isMerged) {
    pSVar7 = (this->satisfiedPredicates).
             super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar21 = (this->satisfiedPredicates).
                   super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
                   ._M_impl.super__Vector_impl_data._M_start; pSVar21 != pSVar7;
        pSVar21 = pSVar21 + 1) {
      SVar3 = pSVar21->identifier;
      pSVar19 = (pvVar12->
                super__Vector_base<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar8 = (pvVar12->
               super__Vector_base<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar23 = (long)pSVar8 - (long)pSVar19;
      lVar22 = (lVar23 >> 3) * -0x3333333333333333 >> 2;
      if (0 < lVar22) {
        lVar23 = lVar22 + 1;
        pSVar24 = pSVar19 + 2;
        do {
          if (pSVar24[-2].identifier == SVar3) {
            pSVar24 = pSVar24 + -2;
            goto LAB_0011eebe;
          }
          if (pSVar24[-1].identifier == SVar3) {
            pSVar24 = pSVar24 + -1;
            goto LAB_0011eebe;
          }
          if (pSVar24->identifier == SVar3) goto LAB_0011eebe;
          if (pSVar24[1].identifier == SVar3) {
            pSVar24 = pSVar24 + 1;
            goto LAB_0011eebe;
          }
          lVar23 = lVar23 + -1;
          pSVar24 = pSVar24 + 4;
        } while (1 < lVar23);
        lVar23 = (long)pSVar8 - (long)(pSVar19 + lVar22 * 4);
        pSVar19 = pSVar19 + lVar22 * 4;
      }
      lVar22 = (lVar23 >> 3) * -0x3333333333333333;
      if (lVar22 == 1) {
LAB_0011eeb5:
        pSVar24 = pSVar8;
        if (pSVar19->identifier == SVar3) {
          pSVar24 = pSVar19;
        }
      }
      else if (lVar22 == 2) {
LAB_0011ee96:
        pSVar24 = pSVar19;
        if (pSVar19->identifier != SVar3) {
          pSVar19 = pSVar19 + 1;
          goto LAB_0011eeb5;
        }
      }
      else {
        pSVar24 = pSVar8;
        if ((lVar22 == 3) && (pSVar24 = pSVar19, pSVar19->identifier != SVar3)) {
          pSVar19 = pSVar19 + 1;
          goto LAB_0011ee96;
        }
      }
LAB_0011eebe:
      local_44 = pSVar21->index;
      if ((pSVar24->func).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar13 = (*(pSVar24->func)._M_invoker)((_Any_data *)&pSVar24->func,state,pTVar11,&local_44);
      if (!bVar13) {
        return (bool)0;
      }
    }
  }
  pCVar16 = (this->consumableFlags).
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar9 = (this->consumableFlags).
           super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar16 != pCVar9) {
    p_Var18 = (state->facts).flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var20 = &(state->facts).flags._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var15 = &p_Var20->_M_header;
      if (p_Var18 != (_Base_ptr)0x0) {
        CVar4 = *pCVar16;
        p_Var17 = &p_Var20->_M_header;
        p_Var25 = p_Var18;
        do {
          if ((int)CVar4 <= (int)p_Var25[1]._M_color) {
            p_Var17 = p_Var25;
          }
          p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < (int)CVar4];
        } while (p_Var25 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var17 != p_Var20) &&
           (p_Var15 = p_Var17, (int)CVar4 < (int)p_Var17[1]._M_color)) {
          p_Var15 = &p_Var20->_M_header;
        }
      }
      if (p_Var15[1].field_0x5 != '\0') {
        return (bool)0;
      }
      pCVar16 = pCVar16 + 1;
    } while (pCVar16 != pCVar9);
  }
  pCVar16 = (this->consumableValues).
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar9 = (this->consumableValues).
           super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar16 != pCVar9) {
    p_Var18 = (state->facts).values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var20 = &(state->facts).values._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var15 = &p_Var20->_M_header;
      if (p_Var18 != (_Base_ptr)0x0) {
        CVar4 = *pCVar16;
        p_Var17 = &p_Var20->_M_header;
        p_Var25 = p_Var18;
        do {
          if ((int)CVar4 <= (int)p_Var25[1]._M_color) {
            p_Var17 = p_Var25;
          }
          p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < (int)CVar4];
        } while (p_Var25 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var17 != p_Var20) &&
           (p_Var15 = p_Var17, (int)CVar4 < (int)p_Var17[1]._M_color)) {
          p_Var15 = &p_Var20->_M_header;
        }
      }
      if (*(char *)&p_Var15[1]._M_parent != '\0') {
        return (bool)0;
      }
      pCVar16 = pCVar16 + 1;
    } while (pCVar16 != pCVar9);
  }
  pCVar16 = (this->consumableVectors).
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar9 = (this->consumableVectors).
           super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar16 == pCVar9) {
    bVar14 = 1;
  }
  else {
    p_Var18 = (state->facts).vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var20 = &(state->facts).vectors._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var15 = &p_Var20->_M_header;
      if (p_Var18 != (_Base_ptr)0x0) {
        CVar4 = *pCVar16;
        p_Var17 = &p_Var20->_M_header;
        p_Var25 = p_Var18;
        do {
          if ((int)CVar4 <= (int)p_Var25[1]._M_color) {
            p_Var17 = p_Var25;
          }
          p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < (int)CVar4];
        } while (p_Var25 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var17 != p_Var20) &&
           (p_Var15 = p_Var17, (int)CVar4 < (int)p_Var17[1]._M_color)) {
          p_Var15 = &p_Var20->_M_header;
        }
      }
    } while ((*(byte *)&p_Var15[1]._M_left == 0) && (pCVar16 = pCVar16 + 1, pCVar16 != pCVar9));
    bVar14 = *(byte *)&p_Var15[1]._M_left ^ 1;
  }
  return (bool)bVar14;
}

Assistant:

bool Condition::isTrue(const WorldState& state, const Task& task, const std::vector<SatisfiablePredicate>& satisfiablePredicates, bool isMerged)
	{
		for (auto& requiredFlag : requiredFlags)
		{
			auto it = state.current.flags.find(requiredFlag.id);

			if (it == end(state.current.flags))
			{
				log("[Condition] ", "ERROR: flag missing");
			}

			if (it->second != requiredFlag.flag)
				return false;
		}

		for (auto& requiredValue : requiredValues)
		{
			auto it = state.current.values.find(requiredValue.id);

			if (it == end(state.current.values))
			{
				log("[Condition] ", "ERROR: flag missing");
			}

			switch (requiredValue.op)
			{
				case ConditionOp::LessThan
					:
				{					
					if (it->second >= requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::LessEqual
					:
				{					
					if (it->second > requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::EqualTo
					:
				{					
					if (it->second != requiredValue.value)
						return false;
					break;
				}
				case ConditionOp::NotEqualTo
					:
				{
					if (it->second == requiredValue.value)
						return false;
					break;
				}
				case ConditionOp::GreaterThan
					:
				{					
					if (it->second <= requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::GreaterEqual
					:
				{					
					if (it->second < requiredValue.value)
						return false;

					break;
				}				
			}
		}		

		if (!isMerged)
		{
			for (auto satisfiable : satisfiedPredicates)
			{			
				const auto& pred = std::find_if(begin(satisfiablePredicates), end(satisfiablePredicates), 
					[satisfiable](const auto& sp) {return sp.identifier == satisfiable.identifier;});
				
				if (!pred->func(state, task, satisfiable.index))
				{
					return false;
				}
			}
		}

		for (auto consumable : consumableFlags)
		{
			auto it = state.facts.flags.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		for (auto consumable : consumableValues)
		{
			auto it = state.facts.values.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		for (auto consumable : consumableVectors)
		{
			auto it = state.facts.vectors.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		return true;
	}